

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O0

TypeDef winmd::reader::find_required(coded_index<winmd::reader::TypeDefOrRef> *type)

{
  TypeDefOrRef TVar1;
  TypeRef TVar2;
  TypeDef TVar3;
  TypeRef local_30;
  index_base<winmd::reader::TypeDefOrRef> *local_20;
  coded_index<winmd::reader::TypeDefOrRef> *type_local;
  uint32_t local_10;
  
  local_20 = (index_base<winmd::reader::TypeDefOrRef> *)type;
  TVar1 = index_base<winmd::reader::TypeDefOrRef>::type
                    ((index_base<winmd::reader::TypeDefOrRef> *)type);
  if (TVar1 == TypeRef) {
    TVar2 = typed_index<winmd::reader::TypeDefOrRef>::TypeRef
                      ((typed_index<winmd::reader::TypeDefOrRef> *)local_20);
    local_30.super_row_base<winmd::reader::TypeRef>.m_table =
         TVar2.super_row_base<winmd::reader::TypeRef>.m_table;
    local_30.super_row_base<winmd::reader::TypeRef>.m_index =
         TVar2.super_row_base<winmd::reader::TypeRef>.m_index;
    TVar3 = find_required(&local_30);
    type_local = (coded_index<winmd::reader::TypeDefOrRef> *)
                 TVar3.super_row_base<winmd::reader::TypeDef>.m_table;
    local_10 = TVar3.super_row_base<winmd::reader::TypeDef>.m_index;
  }
  else {
    TVar1 = index_base<winmd::reader::TypeDefOrRef>::type(local_20);
    if (TVar1 == TypeDef) {
      TVar3 = typed_index<winmd::reader::TypeDefOrRef>::TypeDef
                        ((typed_index<winmd::reader::TypeDefOrRef> *)local_20);
      type_local = (coded_index<winmd::reader::TypeDefOrRef> *)
                   TVar3.super_row_base<winmd::reader::TypeDef>.m_table;
      local_10 = TVar3.super_row_base<winmd::reader::TypeDef>.m_index;
    }
    else {
      memset(&type_local,0,0x10);
      TypeDef::TypeDef((TypeDef *)&type_local);
    }
  }
  TVar3.super_row_base<winmd::reader::TypeDef>.m_index = local_10;
  TVar3.super_row_base<winmd::reader::TypeDef>.m_table = (table_base *)type_local;
  TVar3.super_row_base<winmd::reader::TypeDef>._12_4_ = 0;
  return (TypeDef)TVar3.super_row_base<winmd::reader::TypeDef>;
}

Assistant:

inline TypeDef find_required(coded_index<TypeDefOrRef> const& type)
    {
        if (type.type() == TypeDefOrRef::TypeRef)
        {
            return find_required(type.TypeRef());
        }
        else if (type.type() == TypeDefOrRef::TypeDef)
        {
            return type.TypeDef();
        }
        else
        {
            XLANG_ASSERT(false);
            return {};
        }
    }